

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_distributed_random_value_generation.cc
# Opt level: O2

bool __thiscall
sptk::NormalDistributedRandomValueGeneration::Get
          (NormalDistributedRandomValueGeneration *this,double *output)

{
  double *pdVar1;
  double dVar2;
  
  if (output != (double *)0x0) {
    if (this->switch_ == true) {
      this->switch_ = false;
      pdVar1 = &this->r1_;
      do {
        do {
          dVar2 = anon_unknown.dwarf_48fcc::PseudoRandomGeneration(&this->next_);
          this->r1_ = dVar2 + dVar2 + -1.0;
          dVar2 = anon_unknown.dwarf_48fcc::PseudoRandomGeneration(&this->next_);
          dVar2 = dVar2 + dVar2 + -1.0;
          this->r2_ = dVar2;
          dVar2 = this->r1_ * this->r1_ + dVar2 * dVar2;
          this->s_ = dVar2;
        } while (dVar2 == 0.0);
      } while (1.0 <= dVar2);
      dVar2 = log(dVar2);
      dVar2 = (dVar2 * -2.0) / this->s_;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      this->s_ = dVar2;
    }
    else {
      this->switch_ = true;
      dVar2 = this->r2_;
      pdVar1 = &this->s_;
    }
    *output = dVar2 * *pdVar1;
  }
  return output != (double *)0x0;
}

Assistant:

bool NormalDistributedRandomValueGeneration::Get(double* output) {
  if (NULL == output) {
    return false;
  }

  if (switch_) {
    switch_ = false;
    do {
      r1_ = 2.0 * PseudoRandomGeneration(&(next_)) - 1.0;
      r2_ = 2.0 * PseudoRandomGeneration(&(next_)) - 1.0;
      s_ = r1_ * r1_ + r2_ * r2_;
    } while (0.0 == s_ || 1.0 <= s_);
    s_ = std::sqrt(-2.0 * std::log(s_) / s_);
    *output = r1_ * s_;
  } else {
    switch_ = true;
    *output = r2_ * s_;
  }

  return true;
}